

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O0

void __thiscall QProcess::setStandardOutputFile(QProcess *this,QString *fileName,OpenMode mode)

{
  long lVar1;
  bool bVar2;
  QProcessPrivate *pQVar3;
  undefined4 in_EDX;
  OpenModeFlag in_ESI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QProcessPrivate *d;
  undefined4 in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QProcess *)0x790d6e);
  QProcessPrivate::Channel::operator=((Channel *)CONCAT44(in_EDX,in_stack_fffffffffffffff0),in_RDI);
  bVar2 = ::operator==((QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>)
                       SUB84((ulong)in_RDI >> 0x20,0),in_ESI);
  (pQVar3->stdoutChannel).append = bVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QProcess::setStandardOutputFile(const QString &fileName, OpenMode mode)
{
    Q_ASSERT(mode == Append || mode == Truncate);
    Q_D(QProcess);

    d->stdoutChannel = fileName;
    d->stdoutChannel.append = mode == Append;
}